

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_fatal_error(int from_program)

{
  int in_EDI;
  
  if (infile != (FILE *)0x0) {
    fclose((FILE *)infile);
  }
  if (outfile != (FILE *)0x0) {
    fclose((FILE *)outfile);
  }
  free_sections();
  free_syms();
  free_relocs();
  if (in_EDI != 0) {
    exit(1);
  }
  longjmp((__jmp_buf_tag *)fataljmp,0);
}

Assistant:

void on_fatal_error(int from_program)
{
    if (infile)
        fclose(infile);

    if (outfile)
        fclose(outfile);

    free_sections();
    free_syms();
    free_relocs();

    if (from_program)
        exit(EXIT_FAILURE);
    else
        longjmp(fataljmp, 0);
}